

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

ClassType *
slang::ast::Lookup::findClass
          (NameSyntax *className,ASTContext *context,optional<slang::DiagCode> requireInterfaceClass
          )

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  string_view arg;
  string_view arg_00;
  bool bVar1;
  undefined4 uVar2;
  Type *pTVar3;
  SourceLocation SVar4;
  undefined8 in_RDX;
  Diagnostic *in_RSI;
  SourceRange SVar5;
  NameSyntax *unaff_retaddr;
  bitmask<slang::ast::LookupFlags> in_stack_0000000c;
  ClassType *classType;
  LookupResult result;
  undefined4 in_stack_fffffffffffffc18;
  LookupFlags in_stack_fffffffffffffc1c;
  LookupResult *in_stack_fffffffffffffc20;
  ASTContext *in_stack_fffffffffffffc38;
  SourceLocation in_stack_fffffffffffffc40;
  SourceLocation SVar6;
  SourceLocation in_stack_fffffffffffffc48;
  undefined8 in_stack_fffffffffffffc50;
  DiagCode DVar7;
  Diagnostic *in_stack_fffffffffffffc60;
  size_t in_stack_fffffffffffffc68;
  SyntaxNode *in_stack_fffffffffffffc70;
  bitmask<slang::ast::LookupResultFlags> local_291;
  SourceRange local_290;
  undefined4 local_280;
  bitmask<slang::ast::LookupResultFlags> local_279;
  undefined4 local_278;
  underlying_type local_264;
  long local_260;
  Diagnostic *local_20;
  undefined2 in_stack_fffffffffffffff0;
  undefined2 uVar8;
  ASTContext *in_stack_fffffffffffffff8;
  SourceLocation SVar9;
  
  DVar7 = SUB84((ulong)in_stack_fffffffffffffc50 >> 0x20,0);
  uVar2 = (undefined4)in_RDX;
  uVar8 = (undefined2)((ulong)in_RDX >> 0x20);
  local_20 = in_RSI;
  LookupResult::LookupResult(in_stack_fffffffffffffc20);
  local_264 = (underlying_type)
              ast::operator|((LookupFlags)in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
  name(unaff_retaddr,in_stack_fffffffffffffff8,in_stack_0000000c,
       (LookupResult *)CONCAT26(uVar8,CONCAT42(uVar2,in_stack_fffffffffffffff0)));
  LookupResult::reportDiags
            (in_stack_fffffffffffffc20,
             (ASTContext *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  if (local_260 == 0) {
    SVar9 = (SourceLocation)0x0;
    goto LAB_0047f331;
  }
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::DiagCode> *)0x47eeb1);
  if (bVar1) {
    bitmask<slang::ast::LookupResultFlags>::bitmask(&local_279,FromTypeParam);
    bVar1 = bitmask<slang::ast::LookupResultFlags>::has
                      ((bitmask<slang::ast::LookupResultFlags> *)in_stack_fffffffffffffc20,
                       (bitmask<slang::ast::LookupResultFlags> *)
                       CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    if (bVar1) {
      local_280 = 0xd000a;
      local_290 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffc70);
      SVar5.endLoc = in_stack_fffffffffffffc48;
      SVar5.startLoc = in_stack_fffffffffffffc40;
      ASTContext::addDiag(in_stack_fffffffffffffc38,DVar7,SVar5);
      SVar9 = (SourceLocation)0x0;
      goto LAB_0047f331;
    }
    bitmask<slang::ast::LookupResultFlags>::bitmask(&local_291,FromForwardTypedef);
    bVar1 = bitmask<slang::ast::LookupResultFlags>::has
                      ((bitmask<slang::ast::LookupResultFlags> *)in_stack_fffffffffffffc20,
                       (bitmask<slang::ast::LookupResultFlags> *)
                       CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    if (bVar1) {
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffc70);
      sourceRange.endLoc = in_stack_fffffffffffffc48;
      sourceRange.startLoc = in_stack_fffffffffffffc40;
      ASTContext::addDiag(in_stack_fffffffffffffc38,DVar7,sourceRange);
      SVar9 = (SourceLocation)0x0;
      goto LAB_0047f331;
    }
  }
  bVar1 = Symbol::isType((Symbol *)0x47f089);
  if (bVar1) {
    Symbol::as<slang::ast::Type>((Symbol *)0x47f0ac);
    bVar1 = Type::isClass((Type *)0x47f0bd);
    if (bVar1) {
      pTVar3 = Symbol::as<slang::ast::Type>((Symbol *)0x47f1ee);
      DVar7 = SUB84((ulong)pTVar3 >> 0x20,0);
      SVar4 = (SourceLocation)Type::getCanonicalType((Type *)in_stack_fffffffffffffc20);
      SVar9 = (SourceLocation)Symbol::as<slang::ast::ClassType>((Symbol *)0x47f210);
      SVar6 = SVar9;
      bVar1 = std::optional::operator_cast_to_bool((optional<slang::DiagCode> *)0x47f231);
      if ((bVar1) && ((*(byte *)((long)SVar9 + 0x91) & 1) == 0)) {
        std::optional<slang::DiagCode>::operator*((optional<slang::DiagCode> *)0x47f269);
        SVar5 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffc70);
        sourceRange_01.endLoc = SVar4;
        sourceRange_01.startLoc = SVar6;
        in_stack_fffffffffffffc20 =
             (LookupResult *)ASTContext::addDiag((ASTContext *)SVar5.startLoc,DVar7,sourceRange_01);
        arg_00._M_str = (char *)in_stack_fffffffffffffc70;
        arg_00._M_len = in_stack_fffffffffffffc68;
        Diagnostic::operator<<(in_stack_fffffffffffffc60,arg_00);
        SVar9 = (SourceLocation)0x0;
      }
      goto LAB_0047f331;
    }
  }
  bVar1 = Symbol::isType((Symbol *)0x47f0de);
  if (bVar1) {
    Symbol::as<slang::ast::Type>((Symbol *)0x47f0fb);
    bVar1 = Type::isError((Type *)0x47f10c);
    if (!bVar1) goto LAB_0047f120;
  }
  else {
LAB_0047f120:
    SVar5 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffc70);
    sourceRange_00.endLoc = in_stack_fffffffffffffc48;
    sourceRange_00.startLoc = in_stack_fffffffffffffc40;
    ASTContext::addDiag(in_stack_fffffffffffffc38,DVar7,sourceRange_00);
    arg._M_str = (char *)SVar5.startLoc;
    arg._M_len = (size_t)SVar5.endLoc;
    Diagnostic::operator<<(local_20,arg);
  }
  SVar9 = (SourceLocation)0x0;
LAB_0047f331:
  local_278 = 1;
  LookupResult::~LookupResult(in_stack_fffffffffffffc20);
  return (ClassType *)SVar9;
}

Assistant:

const ClassType* Lookup::findClass(const NameSyntax& className, const ASTContext& context,
                                   std::optional<DiagCode> requireInterfaceClass) {
    LookupResult result;
    Lookup::name(className, context, LookupFlags::Type | LookupFlags::NoSelectors, result);
    result.reportDiags(context);
    if (!result.found)
        return nullptr;

    if (requireInterfaceClass) {
        if (result.flags.has(LookupResultFlags::FromTypeParam)) {
            context.addDiag(diag::IfaceExtendTypeParam, className.sourceRange());
            return nullptr;
        }

        if (result.flags.has(LookupResultFlags::FromForwardTypedef)) {
            context.addDiag(diag::IfaceExtendIncomplete, className.sourceRange());
            return nullptr;
        }
    }

    if (!result.found->isType() || !result.found->as<Type>().isClass()) {
        if (!result.found->isType() || !result.found->as<Type>().isError())
            context.addDiag(diag::NotAClass, className.sourceRange()) << result.found->name;
        return nullptr;
    }

    auto& classType = result.found->as<Type>().getCanonicalType().as<ClassType>();

    if (requireInterfaceClass && !classType.isInterface) {
        context.addDiag(*requireInterfaceClass, className.sourceRange()) << classType.name;
        return nullptr;
    }

    return &classType;
}